

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O0

bool bssl::ssl_get_version_range
               (SSL_HANDSHAKE *hs,uint16_t *out_min_version,uint16_t *out_max_version)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong local_40;
  size_t i;
  ushort local_30;
  uint16_t local_2e;
  uint32_t uStack_2c;
  bool any_enabled;
  uint16_t max_version;
  uint16_t min_version;
  uint32_t options;
  uint16_t *out_max_version_local;
  uint16_t *out_min_version_local;
  SSL_HANDSHAKE *hs_local;
  
  uStack_2c = hs->ssl->options;
  _max_version = out_max_version;
  out_max_version_local = out_min_version;
  out_min_version_local = (uint16_t *)hs;
  iVar3 = SSL_is_dtls(hs->ssl);
  if ((iVar3 != 0) &&
     (uVar4 = uStack_2c & 0xefffffff, uVar1 = uStack_2c & 0x4000000, uStack_2c = uVar4, uVar1 != 0))
  {
    uStack_2c = uVar4 | 0x10000000;
  }
  bVar2 = ssl_protocol_version_from_wire
                    (&local_2e,*(uint16_t *)(*(long *)(out_min_version_local + 4) + 10));
  if ((bVar2) &&
     (bVar2 = ssl_protocol_version_from_wire
                        (&local_30,*(uint16_t *)(*(long *)(out_min_version_local + 4) + 8)), bVar2))
  {
    iVar3 = SSL_is_quic(*(SSL **)out_min_version_local);
    if ((iVar3 != 0) && (local_2e < 0x304)) {
      local_2e = 0x304;
    }
    bVar2 = false;
    for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
      if (local_2e <= *(ushort *)(kProtocolVersions + local_40 * 8)) {
        if (local_30 < *(ushort *)(kProtocolVersions + local_40 * 8)) break;
        if ((uStack_2c & *(uint *)(kProtocolVersions + local_40 * 8 + 4)) == 0) {
          if (!bVar2) {
            bVar2 = true;
            local_2e = *(uint16_t *)(kProtocolVersions + local_40 * 8);
          }
        }
        else if (bVar2) {
          local_30 = *(ushort *)(kProtocolVersions + (local_40 - 1) * 8);
          break;
        }
      }
    }
    if (bVar2) {
      *out_max_version_local = local_2e;
      *_max_version = local_30;
      hs_local._7_1_ = true;
    }
    else {
      ERR_put_error(0x10,0,0x118,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_versions.cc"
                    ,0xf3);
      hs_local._7_1_ = false;
    }
  }
  else {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_versions.cc"
                  ,0xc4);
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_get_version_range(const SSL_HANDSHAKE *hs, uint16_t *out_min_version,
                           uint16_t *out_max_version) {
  // For historical reasons, |SSL_OP_NO_DTLSv1| aliases |SSL_OP_NO_TLSv1|, but
  // DTLS 1.0 should be mapped to TLS 1.1.
  uint32_t options = hs->ssl->options;
  if (SSL_is_dtls(hs->ssl)) {
    options &= ~SSL_OP_NO_TLSv1_1;
    if (options & SSL_OP_NO_DTLSv1) {
      options |= SSL_OP_NO_TLSv1_1;
    }
  }

  uint16_t min_version, max_version;
  if (!ssl_protocol_version_from_wire(&min_version,
                                      hs->config->conf_min_version) ||
      !ssl_protocol_version_from_wire(&max_version,
                                      hs->config->conf_max_version)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // QUIC requires TLS 1.3.
  if (SSL_is_quic(hs->ssl) && min_version < TLS1_3_VERSION) {
    min_version = TLS1_3_VERSION;
  }

  // The |SSL_OP_NO_*| flags disable individual protocols. This has two
  // problems. First, prior to TLS 1.3, the protocol can only express a
  // contiguous range of versions. Second, a library consumer trying to set a
  // maximum version cannot disable protocol versions that get added in a future
  // version of the library.
  //
  // To account for both of these, OpenSSL interprets the client-side bitmask
  // as a min/max range by picking the lowest contiguous non-empty range of
  // enabled protocols. Note that this means it is impossible to set a maximum
  // version of the higest supported TLS version in a future-proof way.
  bool any_enabled = false;
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kProtocolVersions); i++) {
    // Only look at the versions already enabled.
    if (min_version > kProtocolVersions[i].version) {
      continue;
    }
    if (max_version < kProtocolVersions[i].version) {
      break;
    }

    if (!(options & kProtocolVersions[i].flag)) {
      // The minimum version is the first enabled version.
      if (!any_enabled) {
        any_enabled = true;
        min_version = kProtocolVersions[i].version;
      }
      continue;
    }

    // If there is a disabled version after the first enabled one, all versions
    // after it are implicitly disabled.
    if (any_enabled) {
      max_version = kProtocolVersions[i - 1].version;
      break;
    }
  }

  if (!any_enabled) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_NO_SUPPORTED_VERSIONS_ENABLED);
    return false;
  }

  *out_min_version = min_version;
  *out_max_version = max_version;
  return true;
}